

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_kv_cursor_key_callback
              (unqlite_kv_cursor *pCursor,_func_int_void_ptr_uint_void_ptr *xConsumer,
              void *pUserData)

{
  int iVar1;
  
  iVar1 = (*pCursor->pStore->pIo->pMethods->xKey)(pCursor,xConsumer,pUserData);
  return iVar1;
}

Assistant:

int unqlite_kv_cursor_key_callback(unqlite_kv_cursor *pCursor,int (*xConsumer)(const void *,unsigned int,void *),void *pUserData)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	/* Consume the key directly */
	rc = pCursor->pStore->pIo->pMethods->xKey(pCursor,xConsumer,pUserData);
	return rc;
}